

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIListBox::removeItem(CGUIListBox *this,u32 id)

{
  u32 uVar1;
  uint in_ESI;
  long in_RDI;
  CGUIListBox *in_stack_00000030;
  
  uVar1 = core::array<irr::gui::CGUIListBox::ListItem>::size
                    ((array<irr::gui::CGUIListBox::ListItem> *)0x3c0dba);
  if (in_ESI < uVar1) {
    if (*(uint *)(in_RDI + 0x158) == in_ESI) {
      *(undefined4 *)(in_RDI + 0x158) = 0xffffffff;
    }
    else if (in_ESI < *(uint *)(in_RDI + 0x158)) {
      *(int *)(in_RDI + 0x158) = *(int *)(in_RDI + 0x158) + -1;
      uVar1 = os::Timer::getTime();
      *(u32 *)(in_RDI + 0x188) = uVar1;
    }
    core::array<irr::gui::CGUIListBox::ListItem>::erase
              ((array<irr::gui::CGUIListBox::ListItem> *)this,id);
    recalculateItemHeight(in_stack_00000030);
  }
  return;
}

Assistant:

void CGUIListBox::removeItem(u32 id)
{
	if (id >= Items.size())
		return;

	if ((u32)Selected == id) {
		Selected = -1;
	} else if ((u32)Selected > id) {
		Selected -= 1;
		selectTime = os::Timer::getTime();
	}

	Items.erase(id);

	recalculateItemHeight();
}